

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

vector<short,_std::allocator<short>_> * multiplicative_inverse_vector(coefficient_t m)

{
  short sVar1;
  vector<short,_std::allocator<short>_> *this;
  reference pvVar2;
  short in_SI;
  allocator_type *in_RDI;
  coefficient_t a;
  vector<short,_std::allocator<short>_> *inverse;
  allocator_type *this_00;
  undefined2 local_1e;
  
  this = (vector<short,_std::allocator<short>_> *)(long)in_SI;
  this_00 = in_RDI;
  std::allocator<short>::allocator((allocator<short> *)0x136a7d);
  std::vector<short,_std::allocator<short>_>::vector(this,(size_type)this_00,in_RDI);
  std::allocator<short>::~allocator((allocator<short> *)0x136a9d);
  pvVar2 = std::vector<short,_std::allocator<short>_>::operator[]
                     ((vector<short,_std::allocator<short>_> *)this_00,1);
  *pvVar2 = 1;
  for (local_1e = 2; local_1e < in_SI; local_1e = local_1e + 1) {
    pvVar2 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)this_00,
                        (long)((int)in_SI % (int)local_1e));
    sVar1 = *pvVar2;
    pvVar2 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)this_00,(long)local_1e);
    *pvVar2 = in_SI - (short)(((int)sVar1 * ((int)in_SI / (int)local_1e)) % (int)in_SI);
  }
  return (vector<short,_std::allocator<short>_> *)in_RDI;
}

Assistant:

std::vector<coefficient_t> multiplicative_inverse_vector(const coefficient_t m) {
	std::vector<coefficient_t> inverse(m);
	inverse[1] = 1;
	// m = a * (m / a) + m % a
	// Multipying with inverse(a) * inverse(m % a):
	// 0 = inverse(m % a) * (m / a)  + inverse(a)  (mod m)
	for (coefficient_t a = 2; a < m; ++a) inverse[a] = m - (inverse[m % a] * (m / a)) % m;
	return inverse;
}